

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ElabVisitors.h
# Opt level: O2

void __thiscall
slang::ast::DiagnosticVisitor::handle(DiagnosticVisitor *this,CheckerInstanceBodySymbol *symbol)

{
  iterator this_00;
  subrange<slang::ast::Scope::iterator,_slang::ast::Scope::iterator,_(std::ranges::subrange_kind)0>
  sVar1;
  
  if (((this->visitInstances == true) && (*this->numErrors <= (ulong)this->errorLimit)) &&
     ((this->hierarchyProblem & 1U) == 0)) {
    if (symbol->instanceDepth <= (this->compilation->options).maxCheckerInstanceDepth) {
      sVar1 = Scope::members(&symbol->super_Scope);
      for (this_00 = sVar1._M_begin.current; this_00.current != sVar1._M_end.current.current;
          this_00.current = (this_00.current)->nextInScope) {
        Symbol::visit<slang::ast::DiagnosticVisitor&>(this_00.current,this);
      }
      return;
    }
    this->hierarchyProblem = true;
  }
  return;
}

Assistant:

void handle(const CheckerInstanceBodySymbol& symbol) {
        if (!visitInstances || finishedEarly())
            return;

        if (symbol.instanceDepth > compilation.getOptions().maxCheckerInstanceDepth) {
            hierarchyProblem = true;
            return;
        }

        visitDefault(symbol);
    }